

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O0

int Gia_Rsb2ManLevel(Gia_Rsb2Man_t *p)

{
  int iVar1;
  int *piVar2;
  int local_24;
  int Level;
  int *pLevs;
  int i;
  Gia_Rsb2Man_t *p_local;
  
  local_24 = 0;
  Vec_IntClear(&p->vLevels);
  Vec_IntGrow(&p->vLevels,p->nObjs);
  piVar2 = Vec_IntArray(&p->vLevels);
  pLevs._4_4_ = p->nPis;
  while (pLevs._4_4_ = pLevs._4_4_ + 1, pLevs._4_4_ < p->iFirstPo) {
    iVar1 = Abc_MaxInt(piVar2[pLevs._4_4_ * 2] / 2,piVar2[pLevs._4_4_ * 2 + 1] / 2);
    piVar2[pLevs._4_4_] = iVar1 + 1;
  }
  for (pLevs._4_4_ = p->iFirstPo; pLevs._4_4_ < p->nObjs; pLevs._4_4_ = pLevs._4_4_ + 1) {
    iVar1 = piVar2[pLevs._4_4_ << 1];
    piVar2[pLevs._4_4_] = iVar1 / 2;
    local_24 = Abc_MaxInt(local_24,iVar1 / 2);
  }
  return local_24;
}

Assistant:

int Gia_Rsb2ManLevel( Gia_Rsb2Man_t * p )
{
    int i, * pLevs, Level = 0;
    Vec_IntClear( &p->vLevels );
    Vec_IntGrow( &p->vLevels, p->nObjs );
    pLevs = Vec_IntArray( &p->vLevels );
    for ( i = p->nPis + 1; i < p->iFirstPo; i++ )
        pLevs[i] = 1 + Abc_MaxInt( pLevs[2*i+0]/2, pLevs[2*i+1]/2 );
    for ( i = p->iFirstPo; i < p->nObjs; i++ )
        Level = Abc_MaxInt( Level, pLevs[i] = pLevs[2*i+0]/2 );
    return Level;
}